

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorOutputStream.hpp
# Opt level: O2

ssize_t __thiscall
binlog::detail::RecoverableVectorOutputStream::write
          (RecoverableVectorOutputStream *this,int __fd,void *__buf,size_t __n)

{
  long *plVar1;
  pointer pcVar2;
  undefined4 in_register_00000034;
  const_iterator __position;
  long lVar3;
  
  plVar1 = (long *)(this->_vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  __position._M_current =
       (this->_vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((this->_vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage + -(long)plVar1 <
      __position._M_current + ((long)__buf - (long)plVar1)) {
    lVar3 = *plVar1;
    *plVar1 = 0;
    __position._M_current =
         (this->_vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    lVar3 = 0;
  }
  std::vector<char,std::allocator<char>>::insert<char_const*,void>
            ((vector<char,std::allocator<char>> *)this,__position,
             (char *)CONCAT44(in_register_00000034,__fd),
             (char *)((long)__buf + (long)CONCAT44(in_register_00000034,__fd)));
  if (lVar3 != 0) {
    *(long *)(this->_vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start = lVar3;
  }
  pcVar2 = (this->_vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(pointer *)(pcVar2 + 0x10) =
       (this->_vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish + (-0x18 - (long)pcVar2);
  return (ssize_t)this;
}

Assistant:

RecoverableVectorOutputStream& write(const char* buffer, std::streamsize size)
  {
    std::uint64_t magic = 0;
    if (_vector.capacity() < _vector.size() + std::size_t(size))
    {
      // vector will reallocate, clear the magic of the old buffer
      // to avoid recovering invalid data
      magic = clearMagic();
    }

    _vector.insert(_vector.end(), buffer, buffer + size);
    if (magic != 0) { setMagic(magic); }
    updateSize();
    return *this;
  }